

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

void __thiscall Net::learn(Net *this,int global_iterations)

{
  pointer pvVar1;
  pointer pdVar2;
  pointer piVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer pvVar6;
  pointer piVar7;
  int i;
  uint cur_layer;
  int iVar8;
  ulong uVar9;
  int layer;
  int iVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double local_150;
  double local_148;
  allocator_type local_139;
  undefined4 local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  vector<int,_std::allocator<int>_> cur_shuffle;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  derivative;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  bias_derivative;
  vector<double,_std::allocator<double>_> y;
  double divisor;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  dVar13 = (double)global_iterations;
  if (global_iterations < 1) {
    global_iterations = 0;
  }
  local_130 = global_iterations + 1;
  for (local_134 = 1; local_134 != local_130; local_134 = local_134 + 1) {
    uVar5 = 0;
    dVar14 = (double)(int)local_134;
    local_12c = local_134 % 0x32;
    local_138 = (undefined4)CONCAT71((int7)((ulong)local_134 / 0x32 >> 8),1);
    while( true ) {
      iVar8 = (int)uVar5;
      uVar9 = (ulong)iVar8;
      piVar7 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar5 = (long)piVar3 - (long)piVar7 >> 2;
      if (uVar5 <= uVar9) break;
      cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar10 = this->shot;
      lVar11 = uVar9 * 4;
      if (uVar5 < (ulong)(long)(iVar10 + iVar8)) {
        for (; uVar9 < (ulong)((long)piVar3 - (long)piVar7 >> 2); uVar9 = uVar9 + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&cur_shuffle,(value_type_conflict3 *)((long)piVar7 + lVar11));
          piVar7 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          lVar11 = lVar11 + 4;
        }
        uVar5 = uVar9 & 0xffffffff;
      }
      else {
        for (; uVar5 = (ulong)(uint)(iVar10 + iVar8), (long)uVar9 < (long)(iVar10 + iVar8);
            uVar9 = uVar9 + 1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&cur_shuffle,
                     (value_type_conflict3 *)
                     ((long)(this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar11));
          iVar10 = this->shot;
          lVar11 = lVar11 + 4;
        }
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&bias_derivative,&this->init_biases);
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::vector(&derivative,&this->init);
      piVar7 = cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar3 = cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar3 != piVar7; piVar3 = piVar3 + 1) {
        iVar8 = *piVar3;
        pvVar6 = (this->mesh).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data;
        for (uVar9 = 0;
            uVar9 < (ulong)((long)*(pointer *)
                                   ((long)&(pvVar6->
                                           super__Vector_base<double,_std::allocator<double>_>).
                                           _M_impl.super__Vector_impl_data + 8) - lVar11 >> 3);
            uVar9 = uVar9 + 1) {
          dVar15 = Table::get_value(&this->samples,(int)uVar9,iVar8);
          pvVar6 = (this->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar11 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data;
          *(double *)(lVar11 + uVar9 * 8) = dVar15;
        }
        for (iVar10 = 1;
            pvVar1 = (this->mesh).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
            iVar10 < (int)(((long)pvVar1 - (long)pvVar6) / 0x18); iVar10 = iVar10 + 1) {
          propagate_front(this,iVar10);
          pvVar6 = (this->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        divisor = 0.0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)
                   &y.super__Vector_base<double,_std::allocator<double>_>,
                   (long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)pvVar1[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,(value_type_conflict2 *)&divisor,
                   (allocator_type *)&local_148);
        if (this->function_type == TANH) {
          pvVar6 = (this->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          divisor = -1.0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((vector<double,_std::allocator<double>_> *)
                     &y.super__Vector_base<double,_std::allocator<double>_>,
                     (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3,(value_type_conflict2 *)&divisor);
        }
        dVar15 = Table::get_value(&this->answers,0,iVar8);
        y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)dVar15] = 1.0;
        uVar9 = ((long)(this->mesh).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->mesh).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        while (1 < (int)uVar9) {
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)&local_78,
                     (vector<double,_std::allocator<double>_> *)
                     &y.super__Vector_base<double,_std::allocator<double>_>);
          cur_layer = (int)uVar9 - 1;
          propagate_back((vector<double,_std::allocator<double>_> *)&divisor,this,cur_layer,
                         (vector<double,_std::allocator<double>_> *)&local_78,&derivative,
                         &bias_derivative);
          std::vector<double,_std::allocator<double>_>::_M_move_assign
                    ((vector<double,_std::allocator<double>_> *)
                     &y.super__Vector_base<double,_std::allocator<double>_>,
                     (_Vector_base<double,_std::allocator<double>_> *)&divisor);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    ((_Vector_base<double,_std::allocator<double>_> *)&divisor);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
          uVar9 = (ulong)cur_layer;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&y.super__Vector_base<double,_std::allocator<double>_>);
      }
      lVar11 = (long)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      auVar16._8_4_ =
           (int)((long)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start >> 0x22);
      auVar16._0_8_ = lVar11;
      auVar16._12_4_ = 0x45300000;
      divisor = 1.0 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0));
      lVar11 = 0x18;
      for (lVar12 = 1;
          lVar12 < (int)(((long)(this->mesh).
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->mesh).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          lVar12 = lVar12 + 1) {
        mult_matrix_on_constant<double>
                  (&local_48,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)((long)&((derivative.
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11),&divisor);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector(&local_48);
        mult_matrix_on_constant<double>
                  ((vector<double,_std::allocator<double>_> *)&local_60,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&((bias_derivative.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar11),&divisor);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
        local_148 = -1.0;
        mult_matrix_on_constant<double>
                  ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)&y.super__Vector_base<double,_std::allocator<double>_>,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)((long)&((derivative.
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + lVar11),&local_148);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::_M_move_assign((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&((derivative.
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar11),
                         &y.super__Vector_base<double,_std::allocator<double>_>);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&y.super__Vector_base<double,_std::allocator<double>_>);
        local_148 = -1.0;
        mult_matrix_on_constant<double>
                  ((vector<double,_std::allocator<double>_> *)
                   &y.super__Vector_base<double,_std::allocator<double>_>,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&((bias_derivative.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar11),&local_148);
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((bias_derivative.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar11),
                   &y.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&y.super__Vector_base<double,_std::allocator<double>_>);
        add_matrix<double>((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)&y.super__Vector_base<double,_std::allocator<double>_>,
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)((long)&(((this->weights).
                                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      )._M_impl.super__Vector_impl_data + lVar11),
                           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)((long)&((derivative.
                                        super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar11));
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::_M_move_assign((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)((long)&(((this->weights).
                                      super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    )._M_impl.super__Vector_impl_data + lVar11),
                         &y.super__Vector_base<double,_std::allocator<double>_>);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&y.super__Vector_base<double,_std::allocator<double>_>);
        add_matrix<double>((vector<double,_std::allocator<double>_> *)
                           &y.super__Vector_base<double,_std::allocator<double>_>,
                           (vector<double,_std::allocator<double>_> *)
                           ((long)&(((this->biases).
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data + lVar11),
                           (vector<double,_std::allocator<double>_> *)
                           ((long)&((bias_derivative.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar11));
        std::vector<double,_std::allocator<double>_>::_M_move_assign
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((this->biases).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar11),
                   &y.super__Vector_base<double,_std::allocator<double>_>);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&y.super__Vector_base<double,_std::allocator<double>_>);
        lVar11 = lVar11 + 0x18;
      }
      if (((byte)local_138 & local_12c == 0) != 0) {
        poVar4 = std::ostream::_M_insert<double>(dVar14 / dVar13);
        poVar4 = std::operator<<(poVar4,"% finished");
        std::endl<char,std::char_traits<char>>(poVar4);
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          iVar8 = cur_shuffle.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          pvVar6 = (this->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_148 = 0.0;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)
                     &y.super__Vector_base<double,_std::allocator<double>_>,
                     (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3,&local_148,&local_139);
          if (this->function_type == TANH) {
            pvVar6 = (this->mesh).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_148 = -1.0;
            std::vector<double,_std::allocator<double>_>::_M_fill_assign
                      ((vector<double,_std::allocator<double>_> *)
                       &y.super__Vector_base<double,_std::allocator<double>_>,
                       (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3,&local_148);
          }
          dVar15 = Table::get_value(&this->answers,0,iVar8);
          y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)dVar15] = 1.0;
          for (iVar8 = 1;
              pvVar6 = (this->mesh).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              iVar8 < (int)(((long)pvVar6 -
                            (long)(this->mesh).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18);
              iVar8 = iVar8 + 1) {
            propagate_front(this,iVar8);
          }
          pdVar2 = pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_150 = 0.0;
          for (lVar12 = 0;
              (long)pvVar6[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != lVar12;
              lVar12 = lVar12 + 1) {
            dVar15 = pdVar2[lVar12] -
                     y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar12];
            local_150 = local_150 + dVar15 * dVar15;
          }
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_134);
          std::operator<<(poVar4," iteration - COST: ");
          poVar4 = std::ostream::_M_insert<double>(local_150);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                    (&y.super__Vector_base<double,_std::allocator<double>_>);
        }
        local_138 = 0;
      }
      std::
      vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
      ::~vector(&derivative);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&bias_derivative);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&cur_shuffle.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return;
}

Assistant:

void Net::learn(int global_iterations){
    for (int iteration = 1; iteration <= global_iterations; ++iteration) {
        int cur = 0;
        bool ok = true;
        while (cur < shuffler.size()) {
            // get new shuffled data
            std::vector<int> cur_shuffle;
            if (cur + shot > shuffler.size()) {
                for (; cur < shuffler.size(); ++cur)
                    cur_shuffle.push_back(shuffler[cur]);
            } else {
                for (int i = cur; i < cur + shot; ++i)
                    cur_shuffle.push_back(shuffler[i]);
                cur += shot;
            }
            // front propagate each sample
            std::vector<Layer> bias_derivative = init_biases;
            std::vector<std::vector<Layer> > derivative = init;
            for (int i:cur_shuffle) {
                // front propagation
                for (int x = 0; x < mesh[0].size(); ++x)
                    mesh[0][x] = samples.get_value(x, i);
                for (int layer = 1; layer < (int) mesh.size(); ++layer)
                    propagate_front(layer);

                // right answer
                std::vector<double> y(mesh.back().size(), 0);
                if (function_type == TANH)
                    y.assign(mesh.back().size(), -1);
                y[(int) answers.get_value(0, i)] = 1;

//                // counting cost
//                double cost = 0;
//                for (int op = 0; op < mesh.back().size(); ++op)
//                    cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
//                std::cout << iteration << " iteration - COST: " << cost << std::endl;

                // back_propagation
                for (int layer = (int) mesh.size() - 1; layer >= 1; --layer)
                    y = propagate_back(layer, y, derivative, bias_derivative);
            }
            // get average sum
            double divisor = 1.0 / (double) cur_shuffle.size();
            for (int layer = 1; layer < (int) mesh.size(); ++layer) {
                mult_matrix_on_constant(derivative[layer], divisor);
                mult_matrix_on_constant(bias_derivative[layer], divisor);
                // updating weights

                derivative[layer] = mult_matrix_on_constant(derivative[layer], -1.0);
                bias_derivative[layer] = mult_matrix_on_constant(bias_derivative[layer], -1.);
                weights[layer] = add_matrix(weights[layer], derivative[layer]);
                biases[layer] = add_matrix(biases[layer], bias_derivative[layer]);
//                threshold(biases[layer], MOD);
//                for (int x = 0; x < mesh[layer].size(); ++x)
//                    threshold(weights[layer][x], MOD);
            }

            // learning results
            if (ok && iteration % 50 == 0) {
                ok = false;
                std::cout << (double)iteration / (double)global_iterations << "% finished" << std::endl;
                for (int j = 0; j < 2; ++j) {
                    int i = cur_shuffle[j];
                    std::vector<double> y(mesh.back().size(), 0);
                    if (function_type == TANH)
                        y.assign(mesh.back().size(), -1);
                    y[(int) answers.get_value(0, i)] = 1;
                    for (int layer = 1; layer < (int) mesh.size(); ++layer)
                        propagate_front(layer);
                    double cost = 0;
                    for (int op = 0; op < mesh.back().size(); ++op)
                        cost += (mesh.back()[op] - y[op]) * (mesh.back()[op] - y[op]);
                    std::cout << iteration << " iteration - COST: " << cost << std::endl;
                }
            }
        }
    }
}